

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

bool __thiscall QMYSQLResult::isNull(QMYSQLResult *this,int field)

{
  QMYSQLResultPrivate *this_00;
  long i;
  qsizetype qVar1;
  const_reference pQVar2;
  int in_ESI;
  QMYSQLResultPrivate *d;
  
  this_00 = d_func((QMYSQLResult *)0x10c0fb);
  if (-1 < in_ESI) {
    i = (long)in_ESI;
    qVar1 = QList<QMYSQLResultPrivate::QMyField>::size(&this_00->fields);
    if (i < qVar1) {
      if ((this_00->preparedQuery & 1U) != 0) {
        pQVar2 = QList<QMYSQLResultPrivate::QMyField>::at
                           ((QList<QMYSQLResultPrivate::QMyField> *)this_00,i);
        return (bool)(pQVar2->nullIndicator & 1);
      }
      return this_00->row[in_ESI] == (char *)0x0;
    }
  }
  return true;
}

Assistant:

bool QMYSQLResult::isNull(int field)
{
   Q_D(const QMYSQLResult);
   if (field < 0 || field >= d->fields.size())
       return true;
   if (d->preparedQuery)
       return d->fields.at(field).nullIndicator;
   else
       return d->row[field] == nullptr;
}